

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  int *piVar1;
  long lVar2;
  void **ppvVar3;
  long in_RDI;
  int i;
  void *local_d8;
  int *local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  long *local_b8;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined8 local_98;
  int local_8c;
  void **local_78;
  void **local_70;
  void **local_68;
  void **local_60;
  void **local_58;
  int local_38;
  undefined4 local_34;
  void **local_30;
  int local_28;
  undefined4 local_24;
  void **local_20;
  void *local_18;
  void *local_10;
  
  for (local_8c = 0; local_8c < 0x20; local_8c = local_8c + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 8) + (long)local_8c * 0x70) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 8) + (long)local_8c * 0x70 + 4) = 0;
    local_60 = &local_d8;
    local_d8 = (void *)0x0;
    local_d0 = (int *)0x0;
    local_c8 = 0;
    local_c0 = 0;
    local_b8 = (long *)0x0;
    local_b0 = 0;
    local_ac = 0;
    local_a8 = 0;
    local_a4 = 0;
    local_a0 = 0;
    local_98 = 0;
    lVar2 = *(long *)(in_RDI + 8) + (long)local_8c * 0x70;
    ppvVar3 = (void **)(lVar2 + 8);
    local_78 = &local_d8;
    local_70 = ppvVar3;
    if (ppvVar3 != local_78) {
      local_20 = ppvVar3;
      if (*(long *)(lVar2 + 0x10) != 0) {
        piVar1 = *(int **)(lVar2 + 0x10);
        local_24 = 0xffffffff;
        LOCK();
        local_28 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_28 == 1) {
          if (*(long *)(lVar2 + 0x28) == 0) {
            local_18 = *ppvVar3;
            if (local_18 != (void *)0x0) {
              free(local_18);
            }
          }
          else {
            (**(code **)(**(long **)(lVar2 + 0x28) + 0x18))(*(long **)(lVar2 + 0x28),*ppvVar3);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      *(undefined8 *)(lVar2 + 0x18) = 0;
      *(undefined4 *)(lVar2 + 0x20) = 0;
      *(undefined4 *)(lVar2 + 0x30) = 0;
      *(undefined4 *)(lVar2 + 0x34) = 0;
      *(undefined4 *)(lVar2 + 0x38) = 0;
      *(undefined4 *)(lVar2 + 0x3c) = 0;
      *(undefined4 *)(lVar2 + 0x40) = 0;
      *(undefined8 *)(lVar2 + 0x48) = 0;
      *(undefined8 *)(lVar2 + 0x10) = 0;
      *ppvVar3 = *local_78;
      *(void **)(lVar2 + 0x10) = local_78[1];
      *(void **)(lVar2 + 0x18) = local_78[2];
      *(undefined4 *)(lVar2 + 0x20) = *(undefined4 *)(local_78 + 3);
      *(void **)(lVar2 + 0x28) = local_78[4];
      *(undefined4 *)(lVar2 + 0x30) = *(undefined4 *)(local_78 + 5);
      *(undefined4 *)(lVar2 + 0x34) = *(undefined4 *)((long)local_78 + 0x2c);
      *(undefined4 *)(lVar2 + 0x38) = *(undefined4 *)(local_78 + 6);
      *(undefined4 *)(lVar2 + 0x3c) = *(undefined4 *)((long)local_78 + 0x34);
      *(undefined4 *)(lVar2 + 0x40) = *(undefined4 *)(local_78 + 7);
      *(void **)(lVar2 + 0x48) = local_78[8];
    }
    local_58 = &local_d8;
    local_68 = ppvVar3;
    local_30 = local_58;
    if (local_d0 != (int *)0x0) {
      local_34 = 0xffffffff;
      LOCK();
      local_38 = *local_d0;
      *local_d0 = *local_d0 + -1;
      UNLOCK();
      if (local_38 == 1) {
        if (local_b8 == (long *)0x0) {
          local_10 = local_d8;
          if (local_d8 != (void *)0x0) {
            free(local_d8);
          }
        }
        else {
          (**(code **)(*local_b8 + 0x18))(local_b8,local_d8);
        }
      }
    }
    local_d8 = (void *)0x0;
    local_c8 = 0;
    local_c0 = 0;
    local_b0 = 0;
    local_ac = 0;
    local_a8 = 0;
    local_a4 = 0;
    local_a0 = 0;
    local_98 = 0;
    local_d0 = (int *)0x0;
    std::__cxx11::string::clear();
  }
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        d->params[i].type = 0;
        d->params[i].i = 0;
        d->params[i].v = Mat();
        d->params[i].s.clear();
    }
}